

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

string * __thiscall
bssl::(anonymous_namespace)::CipherListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,SSL_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  stack_st_SSL_CIPHER *sk;
  SSL_CIPHER *pSVar3;
  SSL_CIPHER *c;
  char *pcVar4;
  SSL_CIPHER *cipher;
  size_t i;
  stack_st_SSL_CIPHER *ciphers;
  bool in_group;
  SSL_CTX *ctx_local;
  string *ret;
  
  bVar1 = false;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sk = SSL_CTX_get_ciphers((SSL_CTX *)this);
  for (cipher = (SSL_CIPHER *)0x0; pSVar3 = (SSL_CIPHER *)sk_SSL_CIPHER_num(sk), cipher < pSVar3;
      cipher = (SSL_CIPHER *)((long)&cipher->name + 1)) {
    c = (SSL_CIPHER *)sk_SSL_CIPHER_value(sk,(size_t)cipher);
    if ((!bVar1) && (iVar2 = SSL_CTX_cipher_in_group((SSL_CTX *)this,(size_t)cipher), iVar2 != 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t[\n");
      bVar1 = true;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  ");
    }
    pcVar4 = SSL_CIPHER_get_name(c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    if ((bVar1) && (iVar2 = SSL_CTX_cipher_in_group((SSL_CTX *)this,(size_t)cipher), iVar2 == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t]\n");
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string CipherListToString(SSL_CTX *ctx) {
  bool in_group = false;
  std::string ret;
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  for (size_t i = 0; i < sk_SSL_CIPHER_num(ciphers); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (!in_group && SSL_CTX_cipher_in_group(ctx, i)) {
      ret += "\t[\n";
      in_group = true;
    }
    ret += "\t";
    if (in_group) {
      ret += "  ";
    }
    ret += SSL_CIPHER_get_name(cipher);
    ret += "\n";
    if (in_group && !SSL_CTX_cipher_in_group(ctx, i)) {
      ret += "\t]\n";
      in_group = false;
    }
  }
  return ret;
}